

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::CopyImage::IncompatibleFormatsTest::iterate(IncompatibleFormatsTest *this)

{
  int iVar1;
  GLuint GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  size_type sVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_258;
  GetNameFunc local_248;
  int local_240;
  Enum<int,_2UL> local_238;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8;
  MessageBuilder local_1c8;
  Exception *exc;
  reference local_30;
  testCase *test_case;
  bool result;
  long lStack_20;
  IterateResult it_result;
  Functions *gl;
  IncompatibleFormatsTest *pIStack_10;
  GLenum error;
  IncompatibleFormatsTest *this_local;
  
  gl._4_4_ = 0;
  pIStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  test_case._4_4_ = STOP;
  test_case._3_1_ = 0;
  local_30 = std::
             vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
             ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  GVar2 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,local_30->m_tex_target,
                     local_30->m_dst_internal_format,local_30->m_dst_format,local_30->m_dst_type,
                     &this->m_dst_buf_name);
  this->m_dst_tex_name = GVar2;
  GVar2 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,local_30->m_tex_target,
                     local_30->m_src_internal_format,local_30->m_src_format,local_30->m_src_type,
                     &this->m_src_buf_name);
  this->m_src_tex_name = GVar2;
  Utils::makeTextureComplete
            ((this->super_TestCase).m_context,local_30->m_tex_target,this->m_dst_tex_name,0,0);
  Utils::makeTextureComplete
            ((this->super_TestCase).m_context,local_30->m_tex_target,this->m_src_tex_name,0,0);
  (**(code **)(lStack_20 + 0x310))
            (this->m_src_tex_name,local_30->m_tex_target,0,0,0,0,this->m_dst_tex_name,
             local_30->m_tex_target,0,0,0,0,1,1,1);
  gl._4_4_ = (**(code **)(lStack_20 + 0x800))();
  test_case._3_1_ = local_30->m_expected_result == gl._4_4_;
  clean(this);
  if ((test_case._3_1_ & 1) == 1) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
    this->m_test_case_index = this->m_test_case_index + 1;
    sVar5 = std::
            vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
            ::size(&this->m_test_cases);
    if (this->m_test_case_index < sVar5) {
      test_case._4_4_ = CONTINUE;
    }
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_00 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [27])"Failure. Expected result: ")
    ;
    EVar7 = glu::getErrorStr(local_30->m_expected_result);
    local_1e8 = EVar7.m_getName;
    local_1e0 = EVar7.m_value;
    local_1d8.m_getName = local_1e8;
    local_1d8.m_value = local_1e0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2b39b91);
    EVar7 = glu::getErrorStr(gl._4_4_);
    local_208 = EVar7.m_getName;
    local_200 = EVar7.m_value;
    local_1f8.m_getName = local_208;
    local_1f8.m_value = local_200;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])". Texture target: ");
    EVar7 = glu::getTextureTargetStr(local_30->m_tex_target);
    local_228 = EVar7.m_getName;
    local_220 = EVar7.m_value;
    local_218.m_getName = local_228;
    local_218.m_value = local_220;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_218);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])". Source format: ");
    EVar7 = glu::getInternalFormatParameterStr(local_30->m_src_internal_format);
    local_248 = EVar7.m_getName;
    local_240 = EVar7.m_value;
    local_238.m_getName = local_248;
    local_238.m_value = local_240;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_238);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [23])". Destination format: ");
    EVar7 = glu::getInternalFormatParameterStr(local_30->m_dst_internal_format);
    local_258.m_getName = EVar7.m_getName;
    local_258.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_258);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  return test_case._4_4_;
}

Assistant:

tcu::TestNode::IterateResult IncompatibleFormatsTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name = Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, test_case.m_dst_internal_format,
												  test_case.m_dst_format, test_case.m_dst_type, m_dst_buf_name);
		m_src_tex_name = Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, test_case.m_src_internal_format,
												  test_case.m_src_format, test_case.m_src_type, m_src_buf_name);

		/* Make textures complete */
		Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_dst_tex_name, 0 /* base */, 0 /* max */);
		Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_src_tex_name, 0 /* base */, 0 /* max */);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, test_case.m_tex_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
						0 /* srcZ */, m_dst_tex_name, test_case.m_tex_target, 0 /* dstLevel */, 0 /* dstX */,
						0 /* dstY */, 0 /* dstZ */, 1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Remove resources */
	clean();

	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Texture target: " << glu::getTextureTargetStr(test_case.m_tex_target)
			<< ". Source format: " << glu::getInternalFormatParameterStr(test_case.m_src_internal_format)
			<< ". Destination format: " << glu::getInternalFormatParameterStr(test_case.m_dst_internal_format)
			<< tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}